

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::initialize
          (SingleNodeColumnSampler<long_double,_float> *this,double *weights,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *col_indices,size_t curr_pos,
          size_t n_sample,bool backup_weights)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  ulong *puVar1;
  double dVar2;
  pointer puVar3;
  size_t *psVar4;
  pointer pdVar5;
  pointer puVar6;
  _Bit_type *p_Var7;
  runtime_error *this_02;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  size_type __n;
  ulong uVar12;
  bool bVar13;
  longdouble lVar14;
  long local_68;
  ushort uStack_60;
  
  if (curr_pos == 0) {
LAB_00286b55:
    bVar13 = false;
  }
  else {
    puVar3 = (col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    this->col_indices = puVar3;
    this->curr_pos = curr_pos;
    this->n_left = curr_pos;
    this->weights_orig = weights;
    uVar9 = curr_pos - 1 >> 1 | curr_pos - 1;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    uVar9 = uVar9 >> 0x10 | uVar9;
    uVar9 = uVar9 >> 0x20 | uVar9;
    uVar10 = 3;
    if (3 < tab64[(uVar9 - (uVar9 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a] + 1) {
      uVar10 = tab64[(uVar9 - (uVar9 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a] + 1;
    }
    if (uVar10 < n_sample) {
      this->using_tree = true;
      this->backup_weights = false;
      this_00 = &this->used_weights;
      if ((this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<double,_std::allocator<double>_>::reserve
                  (this_00,(long)(col_indices->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (&this->mapped_indices,
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        std::vector<double,_std::allocator<double>_>::reserve
                  (&this->tree_weights,
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(col_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
        curr_pos = this->curr_pos;
      }
      std::vector<double,_std::allocator<double>_>::resize(this_00,curr_pos);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->mapped_indices,this->curr_pos);
      if (this->curr_pos != 0) {
        psVar4 = this->col_indices;
        pdVar5 = (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->mapped_indices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          sVar8 = psVar4[uVar10];
          puVar3[uVar10] = sVar8;
          dVar2 = weights[sVar8];
          pdVar5[uVar10] = dVar2;
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            this->n_left = this->n_left - 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->curr_pos);
      }
      this_01 = &this->tree_weights;
      std::vector<double,_std::allocator<double>_>::resize(this_01,0);
      build_btree_sampler<double>
                (this_01,(this->used_weights).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start,this->curr_pos,&this->tree_levels,
                 &this->offset);
      this->n_inf = 0;
      if (ABS(*(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start) == INFINITY) {
        if ((this->mapped_inf_indices).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->mapped_inf_indices).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&this->mapped_inf_indices,this->curr_pos);
        }
        if (this->curr_pos != 0) {
          psVar4 = this->col_indices;
          pdVar5 = (this->used_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (this->mapped_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar6 = (this->mapped_inf_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            sVar8 = psVar4[uVar10];
            sVar11 = this->n_inf;
            if (ABS(weights[sVar8]) == INFINITY) {
              this->n_inf = sVar11 + 1;
              puVar6[sVar11] = sVar8;
              weights[psVar4[uVar10]] = 0.0;
            }
            else {
              puVar3[uVar10 - sVar11] = sVar8;
              pdVar5[uVar10 - this->n_inf] = weights[psVar4[uVar10]];
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < this->curr_pos);
        }
        std::vector<double,_std::allocator<double>_>::resize(this_01,0);
        build_btree_sampler<double>
                  (this_01,(this->used_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start,this->curr_pos - this->n_inf,
                   &this->tree_levels,&this->offset);
      }
      std::vector<double,_std::allocator<double>_>::resize(this_00,0);
      if ((*(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start <= 0.0) && (this->n_inf == 0)) {
        return false;
      }
    }
    else {
      this->using_tree = false;
      this->backup_weights = backup_weights;
      if (backup_weights) {
        if ((this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::resize
                    (&this->weights_own,
                     (long)(col_indices->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
          curr_pos = this->curr_pos;
        }
        std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                  ((vector<double,std::allocator<double>> *)&this->weights_own,weights,
                   weights + curr_pos);
        curr_pos = this->curr_pos;
        lVar14 = (longdouble)0;
        this->cumw = lVar14;
        if (curr_pos != 0) goto LAB_002869e7;
      }
      else {
        this->cumw = (longdouble)0;
LAB_002869e7:
        sVar8 = this->n_left;
        lVar14 = (longdouble)0;
        sVar11 = 0;
        do {
          dVar2 = weights[this->col_indices[sVar11]];
          lVar14 = lVar14 + (longdouble)dVar2;
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            sVar8 = sVar8 - 1;
            this->n_left = sVar8;
          }
          sVar11 = sVar11 + 1;
        } while (curr_pos != sVar11);
        this->cumw = lVar14;
        if (NAN(lVar14)) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_02,
                     "NAs encountered. Try using a different value for \'missing_action\'.\n");
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      this->n_inf = 0;
      local_68 = SUB108(lVar14,0);
      uStack_60 = (ushort)((unkuint10)lVar14 >> 0x40);
      if ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000) {
        __n = (long)(col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(col_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (((this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
             (this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
           ((this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
          std::vector<bool,_std::allocator<bool>_>::resize(&this->inifinite_weights,__n,false);
        }
        else {
          std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                    (&this->inifinite_weights,__n,false);
        }
        lVar14 = (longdouble)0;
        this->cumw = lVar14;
        uVar10 = this->curr_pos;
        if (uVar10 != 0) {
          p_Var7 = (this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          psVar4 = this->col_indices;
          lVar14 = (longdouble)0;
          uVar9 = 0;
          do {
            if (ABS(weights[psVar4[uVar9]]) == INFINITY) {
              this->n_inf = this->n_inf + 1;
              uVar10 = psVar4[uVar9];
              uVar12 = uVar10 + 0x3f;
              if (-1 < (long)uVar10) {
                uVar12 = uVar10;
              }
              puVar1 = p_Var7 + ((long)uVar12 >> 6) +
                                (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) +
                                0xffffffffffffffff;
              *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
              weights[psVar4[uVar9]] = 0.0;
              uVar10 = this->curr_pos;
            }
            else {
              lVar14 = lVar14 + (longdouble)weights[psVar4[uVar9]];
              this->cumw = lVar14;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar10);
        }
      }
      if (((lVar14 == (longdouble)0) && (!NAN(lVar14) && !NAN((longdouble)0))) && (this->n_inf == 0)
         ) goto LAB_00286b55;
    }
    bVar13 = true;
  }
  return bVar13;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::initialize
(
    double *restrict weights,
    std::vector<size_t> *col_indices,
    size_t curr_pos,
    size_t n_sample,
    bool backup_weights
)
{
    if (!curr_pos) return false;

    this->col_indices = col_indices->data();
    this->curr_pos = curr_pos;
    this->n_left = this->curr_pos;
    this->weights_orig = weights;
    
    if (n_sample > std::max(log2ceil(this->curr_pos), (size_t)3))
    {
        this->using_tree = true;
        this->backup_weights = false;

        if (this->used_weights.empty()) {
            this->used_weights.reserve(col_indices->size());
            this->mapped_indices.reserve(col_indices->size());
            this->tree_weights.reserve(2 * col_indices->size());
        }

        this->used_weights.resize(this->curr_pos);
        this->mapped_indices.resize(this->curr_pos);

        for (size_t col = 0; col < this->curr_pos; col++) {
            this->mapped_indices[col] = this->col_indices[col];
            this->used_weights[col] = weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        this->tree_weights.resize(0);
        build_btree_sampler(this->tree_weights, this->used_weights.data(),
                            this->curr_pos, this->tree_levels, this->offset);

        this->n_inf = 0;
        if (std::isinf(this->tree_weights[0]))
        {
            if (this->mapped_inf_indices.empty())
                this->mapped_inf_indices.resize(this->curr_pos);

            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]]))
                {
                    this->mapped_inf_indices[this->n_inf++] = this->col_indices[col];
                    weights[this->col_indices[col]] = 0;
                }

                else
                {
                    this->mapped_indices[col - this->n_inf] = this->col_indices[col];
                    this->used_weights[col - this->n_inf] = weights[this->col_indices[col]];
                }
            }

            this->tree_weights.resize(0);
            build_btree_sampler(this->tree_weights, this->used_weights.data(),
                                this->curr_pos - this->n_inf, this->tree_levels, this->offset);
        }

        this->used_weights.resize(0);

        if (this->tree_weights[0] <= 0 && !this->n_inf)
            return false;
    }

    else
    {
        this->using_tree = false;
        this->backup_weights = backup_weights;

        if (this->backup_weights)
        {
            if (this->weights_own.empty())
                this->weights_own.resize(col_indices->size());
            this->weights_own.assign(weights, weights + this->curr_pos);
        }

        this->cumw = 0;
        for (size_t col = 0; col < this->curr_pos; col++) {
            this->cumw += weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        if (std::isnan(this->cumw))
            throw std::runtime_error("NAs encountered. Try using a different value for 'missing_action'.\n");

        /* if it's infinite, will choose among columns with infinite weight first */
        this->n_inf = 0;
        if (std::isinf(this->cumw))
        {
            if (this->inifinite_weights.empty())
                this->inifinite_weights.resize(col_indices->size());
            else
                this->inifinite_weights.assign(col_indices->size(), false);

            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]])) {
                    this->n_inf++;
                    this->inifinite_weights[this->col_indices[col]] = true;
                    weights[this->col_indices[col]] = 0;
                }

                else {
                    this->cumw += weights[this->col_indices[col]];
                }
            }
        }

        if (!this->cumw && !this->n_inf) return false;
    }

    return true;
}